

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall
ON_RevSurface::IsCylindrical(ON_RevSurface *this,ON_Cylinder *cylinder,double tolerance)

{
  bool bVar1;
  ulong in_XMM0_Qb;
  double dVar2;
  ulong uVar3;
  double h;
  double r [2];
  ON_Line line;
  ON_Cylinder c;
  double local_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  ON_Line local_f0;
  ON_3dVector local_c0;
  ON_Cylinder local_a8;
  
  local_138 = tolerance;
  uStack_130 = in_XMM0_Qb;
  ON_Cylinder::ON_Cylinder(&local_a8);
  ON_Line::ON_Line(&local_f0);
  local_128 = 0.0;
  dStack_120 = 0.0;
  local_140 = 0.0;
  bVar1 = ON_IsValid(local_138);
  dVar2 = local_138;
  uVar3 = uStack_130;
  if (!bVar1) {
    dVar2 = 2.3283064365386963e-10;
    uVar3 = 0;
  }
  uStack_130 = uVar3 & uStack_130;
  local_138 = (double)(~-(ulong)(0.0 < local_138) & 0x3df0000000000000 |
                      (ulong)dVar2 & -(ulong)(0.0 < local_138));
  bVar1 = ON__IsCylConeHelper(&this->m_axis,this->m_curve,local_138,(ON_Plane *)&local_a8,&local_f0,
                              &local_128,&local_140);
  if (bVar1) {
    local_118 = local_128;
    uStack_110 = 0;
    local_108 = dStack_120;
    uStack_100 = 0;
    if (ABS(local_128 - dStack_120) <= local_138) {
      ON_Line::Tangent(&local_c0,&local_f0);
      dVar2 = ON_3dVector::operator*(&local_c0,&local_a8.circle.plane.xaxis);
      if (ABS(dVar2) <= 2.3283064365386963e-10) {
        local_a8.circle.radius =
             (double)(-(ulong)(local_108 == local_118) & (ulong)local_118 |
                     ~-(ulong)(local_108 == local_118) & (ulong)((local_118 + local_108) * 0.5));
        local_a8.height[0] = 0.0;
        local_a8.height[1] = local_140;
        if (cylinder != (ON_Cylinder *)0x0) {
          memcpy(cylinder,&local_a8,0x98);
        }
        bVar1 = ON_Cylinder::IsValid(&local_a8);
        goto LAB_005a2256;
      }
    }
  }
  bVar1 = false;
LAB_005a2256:
  ON_Line::~ON_Line(&local_f0);
  ON_Cylinder::~ON_Cylinder(&local_a8);
  return bVar1;
}

Assistant:

bool ON_RevSurface::IsCylindrical(
      ON_Cylinder* cylinder,
      double tolerance
      ) const
{
  ON_Cylinder c;
  ON_Line line;
  double r[2] = {0.0,0.0};
  double h = 0.0;
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  if ( !ON__IsCylConeHelper(m_axis,m_curve,tolerance,c.circle.plane,line,r,h) )
    return false;
  if ( fabs(r[0]-r[1]) > tolerance )
    return false;
  if ( fabs(line.Tangent()*c.circle.plane.xaxis) > ON_ZERO_TOLERANCE )
    return false;
  c.circle.radius = (r[0]==r[1]) ? r[0] : (0.5*(r[0]+r[1]));
  c.height[0] = 0.0;
  c.height[1] = h;
  if ( cylinder )
    *cylinder = c;
  return c.IsValid();
}